

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall unitStrings_squared_Test::TestBody(unitStrings_squared_Test *this)

{
  bool bVar1;
  unit *puVar2;
  char *pcVar3;
  uint64_t in_RCX;
  string *psVar4;
  string *psVar5;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  AssertHelper local_190;
  Message local_188;
  unit local_180;
  string local_178;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_4;
  Message local_140;
  unit local_138;
  unit local_130;
  string local_128;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_3;
  Message local_f0;
  unit local_e8;
  string local_e0;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_2;
  Message local_a8;
  unit local_a0;
  string local_98;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_1;
  Message local_60 [3];
  units local_48 [8];
  string local_40;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  unitStrings_squared_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  units::unit::pow((unit *)&units::ft,in_XMM0_Qa,in_XMM1_Qa);
  puVar2 = (unit *)units::getDefaultFlags();
  psVar4 = &local_40;
  units::to_string_abi_cxx11_(psVar4,local_48,puVar2,in_RCX);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[5],_nullptr>
            ((EqHelper *)local_20,"to_string(ft.pow(2))","\"ft^2\"",psVar4,(char (*) [5])"ft^2");
  std::__cxx11::string::~string((string *)&local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_60);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    psVar4 = (string *)0x39;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x39,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_a0 = units::unit::operator*((unit *)&units::N,(unit *)&units::N);
  puVar2 = (unit *)units::getDefaultFlags();
  psVar5 = &local_98;
  units::to_string_abi_cxx11_(psVar5,(units *)&local_a0,puVar2,(uint64_t)psVar4);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_78,"to_string(N * N)","\"N^2\"",psVar5,(char (*) [4])"N^2");
  std::__cxx11::string::~string((string *)&local_98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    psVar5 = (string *)0x3a;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x3a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  local_e8 = units::unit::operator*((unit *)&units::mm,(unit *)&units::mm);
  puVar2 = (unit *)units::getDefaultFlags();
  psVar4 = &local_e0;
  units::to_string_abi_cxx11_(psVar4,(units *)&local_e8,puVar2,(uint64_t)psVar5);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[5],_nullptr>
            ((EqHelper *)local_c0,"to_string(mm * mm)","\"mm^2\"",psVar4,(char (*) [5])0x27d7ca);
  std::__cxx11::string::~string((string *)&local_e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    psVar4 = (string *)0x3b;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x3b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  local_138 = units::unit::operator*((unit *)&units::mm,(unit *)&units::mm);
  local_130 = units::unit::inv(&local_138);
  puVar2 = (unit *)units::getDefaultFlags();
  psVar5 = &local_128;
  units::to_string_abi_cxx11_(psVar5,(units *)&local_130,puVar2,(uint64_t)psVar4);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[7],_nullptr>
            ((EqHelper *)local_108,"to_string((mm * mm).inv())","\"1/mm^2\"",psVar5,
             (char (*) [7])"1/mm^2");
  std::__cxx11::string::~string((string *)&local_128);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    psVar5 = (string *)0x3c;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x3c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  local_180 = units::unit::operator*((unit *)&units::Hz,(unit *)&units::Hz);
  puVar2 = (unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_178,(units *)&local_180,puVar2,(uint64_t)psVar5);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[5],_nullptr>
            ((EqHelper *)local_158,"to_string(Hz * Hz)","\"Hz^2\"",&local_178,(char (*) [5])"Hz^2");
  std::__cxx11::string::~string((string *)&local_178);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_188);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x3d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_190,&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  return;
}

Assistant:

TEST(unitStrings, squared)
{
    EXPECT_EQ(to_string(ft.pow(2)), "ft^2");
    EXPECT_EQ(to_string(N * N), "N^2");
    EXPECT_EQ(to_string(mm * mm), "mm^2");
    EXPECT_EQ(to_string((mm * mm).inv()), "1/mm^2");
    EXPECT_EQ(to_string(Hz * Hz), "Hz^2");
}